

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemFilter.h
# Opt level: O0

IOStream * __thiscall Assimp::FileSystemFilter::Open(FileSystemFilter *this,char *pFile,char *pMode)

{
  IOSystem *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string tmp;
  IOStream *s;
  char *pMode_local;
  char *pFile_local;
  FileSystemFilter *this_local;
  
  if (this->mWrapped == (IOSystem *)0x0) {
    __assert_fail("nullptr != mWrapped",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/FileSystemFilter.h"
                  ,0x7d,
                  "virtual IOStream *Assimp::FileSystemFilter::Open(const char *, const char *)");
  }
  if ((pFile == (char *)0x0) || (pMode == (char *)0x0)) {
    this_local = (FileSystemFilter *)0x0;
  }
  else {
    if (pFile == (char *)0x0) {
      __assert_fail("nullptr != pFile",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/FileSystemFilter.h"
                    ,0x82,
                    "virtual IOStream *Assimp::FileSystemFilter::Open(const char *, const char *)");
    }
    if (pMode == (char *)0x0) {
      __assert_fail("nullptr != pMode",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/FileSystemFilter.h"
                    ,0x83,
                    "virtual IOStream *Assimp::FileSystemFilter::Open(const char *, const char *)");
    }
    iVar2 = (*this->mWrapped->_vptr_IOSystem[4])(this->mWrapped,pFile,pMode);
    tmp.field_2._8_8_ = CONCAT44(extraout_var,iVar2);
    if (tmp.field_2._8_8_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pFile,&local_51);
      std::allocator<char>::~allocator(&local_51);
      BuildPath(this,(string *)local_50);
      pIVar1 = this->mWrapped;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pMode,&local_89);
      tmp.field_2._8_8_ = IOSystem::Open(pIVar1,(string *)local_50,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      if (tmp.field_2._8_8_ == 0) {
        std::__cxx11::string::operator=((string *)local_50,pFile);
        Cleanup(this,(string *)local_50);
        BuildPath(this,(string *)local_50);
        pIVar1 = this->mWrapped;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pMode,&local_b1);
        tmp.field_2._8_8_ = IOSystem::Open(pIVar1,(string *)local_50,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator(&local_b1);
      }
      std::__cxx11::string::~string((string *)local_50);
    }
    this_local = (FileSystemFilter *)tmp.field_2._8_8_;
  }
  return (IOStream *)this_local;
}

Assistant:

IOStream* Open( const char* pFile, const char* pMode = "rb") {
        ai_assert( nullptr != mWrapped );
        if ( nullptr == pFile || nullptr == pMode ) {
            return nullptr;
        }
        
        ai_assert( nullptr != pFile );
        ai_assert( nullptr != pMode );

        // First try the unchanged path
        IOStream* s = mWrapped->Open(pFile,pMode);

        if (nullptr == s) {
            std::string tmp = pFile;

            // Try to convert between absolute and relative paths
            BuildPath(tmp);
            s = mWrapped->Open(tmp,pMode);

            if (nullptr == s) {
                // Finally, look for typical issues with paths
                // and try to correct them. This is our last
                // resort.
                tmp = pFile;
                Cleanup(tmp);
                BuildPath(tmp);
                s = mWrapped->Open(tmp,pMode);
            }
        }

        return s;
    }